

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

wchar_t cmp_for_sort_items(void *left,void *right)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  int local_2c;
  wchar_t cres;
  wchar_t i;
  wchar_t iright;
  wchar_t ileft;
  void *right_local;
  void *left_local;
  
  iVar1 = *left;
  iVar2 = *right;
  local_2c = 0;
  while( true ) {
    if (sort_dat.arr[local_2c].func == (equippable_cmpfunc)0x0) {
      return L'\0';
    }
    wVar3 = (*sort_dat.arr[local_2c].func)
                      (sort_dat.items + iVar1,sort_dat.items + iVar2,sort_dat.arr[local_2c].propind)
    ;
    if (wVar3 != L'\0') break;
    local_2c = local_2c + 1;
  }
  return wVar3;
}

Assistant:

static int cmp_for_sort_items(const void *left, const void *right)
{
	int ileft = *((int*) left);
	int iright = *((int*) right);
	int i = 0;

	while (1) {
		int cres;

		if (sort_dat.arr[i].func == 0) {
			return 0;
		}
		cres = (*sort_dat.arr[i].func)(sort_dat.items + ileft,
			sort_dat.items + iright, sort_dat.arr[i].propind);
		if (cres != 0) {
			return cres;
		}
		++i;
	}
}